

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  ulong uVar1;
  size_type sVar2;
  SourceLocation *pSVar3;
  SourceLocation *pSVar4;
  size_type sVar5;
  SourceLocation *pSVar6;
  long lVar7;
  ulong capacity;
  SourceLocation *pSVar8;
  
  pSVar8 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar1 = this->cap;
    if (capacity < uVar1 * 2) {
      capacity = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    lVar7 = (long)pSVar8 - (long)this->data_;
    pSVar3 = (SourceLocation *)detail::allocArray(capacity,8);
    *(SourceLocation *)((long)pSVar3 + lVar7) = *args;
    pSVar4 = this->data_;
    sVar5 = this->len;
    if (pSVar4 + sVar5 == pSVar8) {
      pSVar6 = pSVar3;
      if (sVar5 != 0) {
        do {
          *pSVar6 = *pSVar4;
          pSVar4 = pSVar4 + 1;
          pSVar6 = pSVar6 + 1;
        } while (pSVar4 != pSVar8);
      }
    }
    else {
      pSVar6 = pSVar3;
      if (pSVar4 != pSVar8) {
        do {
          *pSVar6 = *pSVar4;
          pSVar4 = pSVar4 + 1;
          pSVar6 = pSVar6 + 1;
        } while (pSVar4 != pSVar8);
        pSVar4 = this->data_;
        sVar5 = this->len;
      }
      if (pSVar4 + sVar5 != pSVar8) {
        pSVar6 = (SourceLocation *)((long)pSVar3 + lVar7);
        do {
          pSVar6 = pSVar6 + 1;
          *pSVar6 = *pSVar8;
          pSVar8 = pSVar8 + 1;
        } while (pSVar8 != pSVar4 + sVar5);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pSVar3;
    return (reference)((long)pSVar3 + lVar7);
  }
  *pSVar8 = *args;
  sVar5 = this->len;
  sVar2 = sVar5 + 1;
  this->len = sVar2;
  if (sVar2 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::SourceLocation>::back() [T = slang::SourceLocation]"
              );
  }
  return this->data_ + sVar5;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }